

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alGetSourceiv(CallerInfo *callerinfo,ALuint name,ALenum param,ALboolean isenum,
                       ALint *origvalues,uint32 numvals,ALint *values)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_30;
  uint32 i;
  uint32 numvals_local;
  ALint *origvalues_local;
  ALboolean isenum_local;
  ALenum param_local;
  ALuint name_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = sourceString(name);
  pcVar2 = alenumString(param);
  pcVar3 = ptrString(origvalues);
  printf("(%s, %s, %s)",pcVar1,pcVar2,pcVar3);
  if (origvalues != (ALint *)0x0) {
    printf(" => {");
    for (local_30 = 0; local_30 < numvals; local_30 = local_30 + 1) {
      if (isenum == '\0') {
        pcVar1 = "";
        if (local_30 != 0) {
          pcVar1 = ",";
        }
        printf("%s %d",pcVar1,(ulong)(uint)values[local_30]);
      }
      else {
        pcVar1 = "";
        if (local_30 != 0) {
          pcVar1 = ",";
        }
        pcVar2 = alenumString(values[local_30]);
        printf("%s %s",pcVar1,pcVar2);
      }
    }
    pcVar1 = "";
    if (numvals != 0) {
      pcVar1 = " ";
    }
    printf("%s}",pcVar1);
  }
  printf("\n");
  return;
}

Assistant:

static void dump_alGetSourceiv(CallerInfo *callerinfo, ALuint name, ALenum param, ALboolean isenum, ALint *origvalues, uint32 numvals, ALint *values)
{
    uint32 i;
    printf("(%s, %s, %s)", sourceString(name), alenumString(param), ptrString(origvalues));
    if (origvalues) {
        printf(" => {");
        for (i = 0; i < numvals; i++) {
            if (isenum) {
                printf("%s %s", i > 0 ? "," : "", alenumString((ALenum) values[i]));
            } else {
                printf("%s %d", i > 0 ? "," : "", (int) values[i]);
            }
        }
        printf("%s}", numvals > 0 ? " " : "");
    }
    printf("\n");
}